

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_pass.cc
# Opt level: O1

ssize_t sock_fd_read(int sock,void *buf,ssize_t bufsize,int *fd)

{
  int iVar1;
  ssize_t sVar2;
  undefined4 extraout_var;
  undefined4 in_register_0000003c;
  int *piVar3;
  iovec iov;
  msghdr msg;
  anon_union_56_2_2032e646 cmsgu;
  iovec local_90;
  msghdr local_80;
  long local_48 [7];
  
  piVar3 = (int *)CONCAT44(in_register_0000003c,sock);
  if (fd == (int *)0x0) {
    sVar2 = read(sock,buf,bufsize);
    if (-1 < sVar2) {
      return sVar2;
    }
  }
  else {
    local_80.msg_iov = &local_90;
    local_80.msg_name = (void *)0x0;
    local_80.msg_namelen = 0;
    local_80.msg_iovlen = 1;
    local_80.msg_control = local_48;
    local_80.msg_controllen = 0x18;
    local_90.iov_base = buf;
    local_90.iov_len = bufsize;
    sVar2 = recvmsg(sock,&local_80,0);
    if (-1 < sVar2) {
      if (((long *)local_80.msg_control == (long *)0x0 || local_80.msg_controllen < 0x10) ||
         (*local_80.msg_control != 0x14)) {
        *fd = -1;
        return sVar2;
      }
      piVar3 = (int *)(ulong)*(uint *)((long)local_80.msg_control + 8);
      if (*(uint *)((long)local_80.msg_control + 8) == 1) {
        *fd = (int)*(long *)((long)local_80.msg_control + 0x10);
        printf("received fd %d\n");
        return sVar2;
      }
      goto LAB_0010751f;
    }
    sock_fd_read();
  }
  sock_fd_read();
LAB_0010751f:
  sock_fd_read();
  close(*piVar3);
  iVar1 = close(piVar3[1]);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

ssize_t
sock_fd_read(int sock, void *buf, ssize_t bufsize, int *fd)
{
    ssize_t size;

    if(fd){
        struct msghdr msg;
        struct iovec iov;
        union{
            struct msghdr cmsghdr;
            char control[CMSG_SPACE(sizeof (int))];
        } cmsgu;
        struct cmsghdr *cmsg;

        iov.iov_base = buf;
        iov.iov_len = bufsize;

        msg.msg_name = NULL;
        msg.msg_namelen = 0;
        msg.msg_iov = &iov;
        msg.msg_iovlen = 1;
        msg.msg_control = cmsgu.control;
        msg.msg_controllen = sizeof(cmsgu.control);

        size = recvmsg(sock, &msg, 0);
        if(size < 0){
            perror ("recvmsg");
            exit(1);
        }
        cmsg = CMSG_FIRSTHDR(&msg);

        if(cmsg && cmsg->cmsg_len == CMSG_LEN(sizeof (int))){
            if(cmsg->cmsg_level !=SOL_SOCKET){
                fprintf(stderr, "invalid cmsg_level %d\n",
                        cmsg->cmsg_level);
                exit(1);
            }

            *fd = *((int *) CMSG_DATA(cmsg));
            printf ("received fd %d\n", *fd);
        } else {
            *fd = -1;
        }
    } else {
        size = read(sock, buf, bufsize);
        if(size < 0){
            perror("read");
            exit(1);
        }
    }
    return size;
}